

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

void __thiscall Matrix::One(Matrix *this)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  
  iVar1 = this->rowNo;
  if (0 < (long)iVar1) {
    uVar2 = this->colNo;
    ppdVar3 = this->array;
    lVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar4 = ppdVar3[lVar5];
        uVar6 = 0;
        do {
          pdVar4[uVar6] = 1.0;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return;
}

Assistant:

void Matrix::One()
{

    for (int i = 0; i < rowNo; i++)
    {
        for (int j = 0; j < colNo; j++)
        {
            array[i][j] = 1;
        }
    }

}